

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.c
# Opt level: O1

void sum_histograms(uint32_t kHistBuckets,uint32_t kHistSize,uint32_t *hist)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long lVar3;
  ulong uVar4;
  uint32_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t *puVar8;
  ulong uVar9;
  
  uVar4 = (ulong)kHistBuckets;
  lVar3 = -0x18 - (uVar4 * 4 + 0xf & 0xfffffffffffffff0);
  uVar6 = (ulong)kHistSize;
  if (kHistBuckets != 0) {
    uVar7 = 0;
    puVar5 = hist;
    do {
      *(uint32_t *)(&stack0xffffffffffffffe8 + uVar7 * 4 + lVar3 + 0x18) = *puVar5;
      *puVar5 = 0;
      uVar7 = uVar7 + 1;
      puVar5 = puVar5 + uVar6;
    } while (uVar4 != uVar7);
  }
  if (1 < kHistSize) {
    puVar5 = hist + 1;
    uVar7 = 1;
    do {
      if (kHistBuckets != 0) {
        uVar9 = 0;
        puVar8 = puVar5;
        do {
          uVar1 = *(uint32_t *)(&stack0xffffffffffffffe8 + uVar9 * 4 + lVar3 + 0x18);
          uVar2 = *puVar8;
          *puVar8 = uVar1;
          *(uint32_t *)(&stack0xffffffffffffffe8 + uVar9 * 4 + lVar3 + 0x18) = uVar2 + uVar1;
          uVar9 = uVar9 + 1;
          puVar8 = puVar8 + uVar6;
        } while (uVar4 != uVar9);
      }
      uVar7 = uVar7 + 1;
      puVar5 = puVar5 + 1;
    } while (uVar7 != uVar6);
  }
  return;
}

Assistant:

static void sum_histograms(uint32_t kHistBuckets, uint32_t kHistSize, uint32_t* restrict hist)
{
    uint32_t sum[kHistBuckets];
    for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
    {
        uint32_t* restrict offset = hist + (bucket * kHistSize);
        sum[bucket] = offset[0];
        offset[0] = 0;
    }

    uint32_t tsum;
    for (uint32_t i = 1; i < kHistSize; ++i)
    {
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            uint32_t* restrict offset = hist + (bucket * kHistSize);
            tsum = offset[i] + sum[bucket];
            offset[i] = sum[bucket];
            sum[bucket] = tsum;
        }
    }
}